

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O1

void __thiscall
CRenderTools::RenderQuads
          (CRenderTools *this,CQuad *pQuads,int NumQuads,int RenderFlags,ENVELOPE_EVAL pfnEval,
          void *pUser)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  byte bVar9;
  byte bVar10;
  long lVar11;
  CPoint *pCVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float aChannels [4];
  vec2 aTexCoords [4];
  float local_118;
  float local_f8;
  float fStack_f4;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float fStack_98;
  undefined4 local_94;
  float local_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined4 local_80;
  float local_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  undefined4 local_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  if (0 < NumQuads) {
    uVar13 = 0;
    do {
      pCVar12 = pQuads[uVar13].m_aPoints;
      fVar14 = 1.0;
      fVar15 = 1.0;
      fVar16 = 1.0;
      fVar18 = 1.0;
      if (-1 < pQuads[uVar13].m_ColorEnv) {
        (*pfnEval)((float)((CQuad *)pCVar12)->m_ColorEnvOffset / 1000.0,pQuads[uVar13].m_ColorEnv,
                   &local_a8,pUser);
        fVar14 = fStack_a4;
        fVar15 = fStack_a0;
        fVar16 = fStack_9c;
        fVar18 = local_a8;
      }
      local_58[4] = (float)((CQuad *)pCVar12)->m_aTexcoords[2].x * 0.0009765625;
      local_58[5] = (float)((CQuad *)pCVar12)->m_aTexcoords[2].y * 0.0009765625;
      local_58[6] = (float)((CQuad *)pCVar12)->m_aTexcoords[3].x * 0.0009765625;
      local_58[7] = (float)((CQuad *)pCVar12)->m_aTexcoords[3].y * 0.0009765625;
      local_58[0] = (float)((CQuad *)pCVar12)->m_aTexcoords[0].x * 0.0009765625;
      local_58[1] = (float)((CQuad *)pCVar12)->m_aTexcoords[0].y * 0.0009765625;
      local_58[2] = (float)((CQuad *)pCVar12)->m_aTexcoords[1].x * 0.0009765625;
      local_58[3] = (float)((CQuad *)pCVar12)->m_aTexcoords[1].y * 0.0009765625;
      lVar11 = 0;
      bVar9 = 0;
      bVar10 = 0;
      do {
        if (1.0 < local_58[lVar11 * 2]) {
          bVar10 = 1;
        }
        if (local_58[lVar11 * 2] < 0.0) {
          bVar10 = 1;
        }
        if (1.0 < local_58[lVar11 * 2 + 1]) {
          bVar9 = 1;
        }
        if (local_58[lVar11 * 2 + 1] < 0.0) {
          bVar9 = 1;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0xc])
                (this->m_pGraphics,(ulong)(byte)~bVar10 & 0xffffffffffffff01,(ulong)(~bVar9 & 1),
                 (ulong)(byte)~bVar10 & 0xffffffffffffff01);
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1b])
                (local_58[0],local_58[1],local_58[2],local_58[3],local_58[4],local_58[5],local_58[6]
                 ,local_58[7],this->m_pGraphics,0xffffffff);
      if (((CQuad *)pCVar12)->m_PosEnv < 0) {
        local_f8 = 0.0;
        fStack_f4 = 0.0;
        local_118 = 0.0;
      }
      else {
        (*pfnEval)((float)((CQuad *)pCVar12)->m_PosEnvOffset / 1000.0,((CQuad *)pCVar12)->m_PosEnv,
                   &local_a8,pUser);
        local_f8 = local_a8;
        fStack_f4 = fStack_a4;
        local_118 = (fStack_a0 / 360.0) * 3.1415927;
        local_118 = local_118 + local_118;
      }
      fVar17 = (float)((CQuad *)pCVar12)->m_aColors[0].a;
      uVar1 = ((CQuad *)pCVar12)->m_aColors[0].g;
      uVar5 = ((CQuad *)pCVar12)->m_aColors[0].b;
      local_a8 = 0.0;
      fStack_a4 = (float)((CQuad *)pCVar12)->m_aColors[0].r * 0.003921569 * fVar18 * fVar17 *
                  0.003921569 * fVar16;
      fStack_a0 = fVar17 * (float)(int)uVar1 * 0.003921569 * fVar14 * 0.003921569 * fVar16;
      fStack_9c = fVar17 * (float)(int)uVar5 * 0.003921569 * fVar15 * 0.003921569 * fVar16;
      fStack_98 = fVar17 * 0.003921569 * fVar16;
      fVar17 = (float)((CQuad *)pCVar12)->m_aColors[1].a;
      uVar2 = ((CQuad *)pCVar12)->m_aColors[1].g;
      uVar6 = ((CQuad *)pCVar12)->m_aColors[1].b;
      local_94 = 1;
      local_90 = (float)((CQuad *)pCVar12)->m_aColors[1].r * 0.003921569 * fVar18 * fVar17 *
                 0.003921569 * fVar16;
      fStack_8c = fVar17 * (float)(int)uVar2 * 0.003921569 * fVar14 * 0.003921569 * fVar16;
      fStack_88 = fVar17 * (float)(int)uVar6 * 0.003921569 * fVar15 * 0.003921569 * fVar16;
      fStack_84 = fVar17 * 0.003921569 * fVar16;
      fVar17 = (float)((CQuad *)pCVar12)->m_aColors[2].a;
      uVar3 = ((CQuad *)pCVar12)->m_aColors[2].g;
      uVar7 = ((CQuad *)pCVar12)->m_aColors[2].b;
      local_80 = 2;
      local_7c = (float)((CQuad *)pCVar12)->m_aColors[2].r * 0.003921569 * fVar18 * fVar17 *
                 0.003921569 * fVar16;
      fStack_78 = fVar17 * (float)(int)uVar3 * 0.003921569 * fVar14 * 0.003921569 * fVar16;
      fStack_74 = fVar17 * (float)(int)uVar7 * 0.003921569 * fVar15 * 0.003921569 * fVar16;
      fStack_70 = fVar17 * 0.003921569 * fVar16;
      fVar17 = (float)((CQuad *)pCVar12)->m_aColors[3].a;
      uVar4 = ((CQuad *)pCVar12)->m_aColors[3].g;
      uVar8 = ((CQuad *)pCVar12)->m_aColors[3].b;
      local_6c = 3;
      local_68 = (float)((CQuad *)pCVar12)->m_aColors[3].r * 0.003921569 * fVar18 * fVar17 *
                 0.003921569 * fVar16;
      fStack_64 = fVar17 * (float)(int)uVar4 * 0.003921569 * fVar14 * 0.003921569 * fVar16;
      fStack_60 = fVar17 * (float)(int)uVar8 * 0.003921569 * fVar15 * 0.003921569 * fVar16;
      fStack_5c = fVar17 * 0.003921569 * fVar16;
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x20])(this->m_pGraphics,&local_a8,4)
      ;
      if ((local_118 != 0.0) || (NAN(local_118))) {
        RenderQuads::aRotated[0] = ((CQuad *)pCVar12)->m_aPoints[0];
        RenderQuads::aRotated[1] = ((CQuad *)pCVar12)->m_aPoints[1];
        RenderQuads::aRotated[2] = ((CQuad *)pCVar12)->m_aPoints[2];
        RenderQuads::aRotated[3] = ((CQuad *)pCVar12)->m_aPoints[3];
        pCVar12 = ((CQuad *)pCVar12)->m_aPoints + 4;
        Rotate(pCVar12,RenderQuads::aRotated,local_118);
        Rotate(pCVar12,RenderQuads::aRotated + 1,local_118);
        Rotate(pCVar12,RenderQuads::aRotated + 2,local_118);
        Rotate(pCVar12,RenderQuads::aRotated + 3,local_118);
        pCVar12 = RenderQuads::aRotated;
      }
      local_c8 = (float)((CQuad *)pCVar12)->m_aPoints[0].x * 0.0009765625 + local_f8;
      fStack_c4 = (float)((CQuad *)pCVar12)->m_aPoints[0].y * 0.0009765625 + fStack_f4;
      fStack_c0 = (float)((CQuad *)pCVar12)->m_aPoints[1].x * 0.0009765625 + local_f8;
      fStack_bc = (float)((CQuad *)pCVar12)->m_aPoints[1].y * 0.0009765625 + fStack_f4;
      local_b8 = (float)((CQuad *)pCVar12)->m_aPoints[2].x * 0.0009765625 + local_f8;
      fStack_b4 = (float)((CQuad *)pCVar12)->m_aPoints[2].y * 0.0009765625 + fStack_f4;
      fStack_b0 = (float)((CQuad *)pCVar12)->m_aPoints[3].x * 0.0009765625 + local_f8;
      fStack_ac = (float)((CQuad *)pCVar12)->m_aPoints[3].y * 0.0009765625 + fStack_f4;
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(this->m_pGraphics,&local_c8,1)
      ;
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)NumQuads);
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[10])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRenderTools::RenderQuads(const CQuad *pQuads, int NumQuads, int RenderFlags, ENVELOPE_EVAL pfnEval, void *pUser)
{
	Graphics()->QuadsBegin();
	float Conv = 1/255.0f;
	for(int i = 0; i < NumQuads; i++)
	{
		const CQuad *q = &pQuads[i];

		float r=1, g=1, b=1, a=1;

		if(q->m_ColorEnv >= 0)
		{
			float aChannels[4];
			pfnEval(q->m_ColorEnvOffset/1000.0f, q->m_ColorEnv, aChannels, pUser);
			r = aChannels[0];
			g = aChannels[1];
			b = aChannels[2];
			a = aChannels[3];
		}

		/*bool Opaque = false;
		 TODO: Analyze quadtexture
		if(a < 0.01f || (q->m_aColors[0].a < 0.01f && q->m_aColors[1].a < 0.01f && q->m_aColors[2].a < 0.01f && q->m_aColors[3].a < 0.01f))
			Opaque = true;

		if(Opaque && !(RenderFlags&LAYERRENDERFLAG_OPAQUE))
			continue;
		if(!Opaque && !(RenderFlags&LAYERRENDERFLAG_TRANSPARENT))
			continue;
		*/
		vec2 aTexCoords[4];
		for(int k = 0; k < 4; k++)
		{
			aTexCoords[k].x = fx2f(q->m_aTexcoords[k].x);
			aTexCoords[k].y = fx2f(q->m_aTexcoords[k].y);
		}

		// Check if we want to repeat the texture
		// Otherwise clamp to the edge to prevent texture bleeding
		bool RepeatU = false, RepeatV = false;
		for(int k = 0; k < 4; k++)
		{
			if(aTexCoords[k].x < 0.0f || aTexCoords[k].x > 1.0f)
				RepeatU = true;
			if(aTexCoords[k].y < 0.0f || aTexCoords[k].y > 1.0f)
				RepeatV = true;
		}
		Graphics()->WrapMode(
			RepeatU ? IGraphics::WRAP_REPEAT : IGraphics::WRAP_CLAMP,
			RepeatV ? IGraphics::WRAP_REPEAT : IGraphics::WRAP_CLAMP);

		Graphics()->QuadsSetSubsetFree(
			aTexCoords[0].x, aTexCoords[0].y,
			aTexCoords[1].x, aTexCoords[1].y,
			aTexCoords[2].x, aTexCoords[2].y,
			aTexCoords[3].x, aTexCoords[3].y);

		float OffsetX = 0;
		float OffsetY = 0;
		float Rot = 0;

		// TODO: fix this
		if(q->m_PosEnv >= 0)
		{
			float aChannels[4];
			pfnEval(q->m_PosEnvOffset/1000.0f, q->m_PosEnv, aChannels, pUser);
			OffsetX = aChannels[0];
			OffsetY = aChannels[1];
			Rot = aChannels[2]/360.0f*pi*2;
		}

		IGraphics::CColorVertex Array[4] = {
			IGraphics::CColorVertex(0, q->m_aColors[0].r*Conv*r*q->m_aColors[0].a*Conv*a, q->m_aColors[0].g*Conv*g*q->m_aColors[0].a*Conv*a, q->m_aColors[0].b*Conv*b*q->m_aColors[0].a*Conv*a, q->m_aColors[0].a*Conv*a),
			IGraphics::CColorVertex(1, q->m_aColors[1].r*Conv*r*q->m_aColors[1].a*Conv*a, q->m_aColors[1].g*Conv*g*q->m_aColors[1].a*Conv*a, q->m_aColors[1].b*Conv*b*q->m_aColors[1].a*Conv*a, q->m_aColors[1].a*Conv*a),
			IGraphics::CColorVertex(2, q->m_aColors[2].r*Conv*r*q->m_aColors[2].a*Conv*a, q->m_aColors[2].g*Conv*g*q->m_aColors[2].a*Conv*a, q->m_aColors[2].b*Conv*b*q->m_aColors[2].a*Conv*a, q->m_aColors[2].a*Conv*a),
			IGraphics::CColorVertex(3, q->m_aColors[3].r*Conv*r*q->m_aColors[3].a*Conv*a, q->m_aColors[3].g*Conv*g*q->m_aColors[3].a*Conv*a, q->m_aColors[3].b*Conv*b*q->m_aColors[3].a*Conv*a, q->m_aColors[3].a*Conv*a)};
		Graphics()->SetColorVertex(Array, 4);

		const CPoint *pPoints = q->m_aPoints;

		if(Rot != 0)
		{
			static CPoint aRotated[4];
			aRotated[0] = q->m_aPoints[0];
			aRotated[1] = q->m_aPoints[1];
			aRotated[2] = q->m_aPoints[2];
			aRotated[3] = q->m_aPoints[3];
			pPoints = aRotated;

			Rotate(&q->m_aPoints[4], &aRotated[0], Rot);
			Rotate(&q->m_aPoints[4], &aRotated[1], Rot);
			Rotate(&q->m_aPoints[4], &aRotated[2], Rot);
			Rotate(&q->m_aPoints[4], &aRotated[3], Rot);
		}

		IGraphics::CFreeformItem Freeform(
			fx2f(pPoints[0].x)+OffsetX, fx2f(pPoints[0].y)+OffsetY,
			fx2f(pPoints[1].x)+OffsetX, fx2f(pPoints[1].y)+OffsetY,
			fx2f(pPoints[2].x)+OffsetX, fx2f(pPoints[2].y)+OffsetY,
			fx2f(pPoints[3].x)+OffsetX, fx2f(pPoints[3].y)+OffsetY);
		Graphics()->QuadsDrawFreeform(&Freeform, 1);
	}
	Graphics()->QuadsEnd();
	Graphics()->WrapNormal();
}